

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

string * __thiscall
duckdb::CastExceptionText<unsigned_short,double>
          (string *__return_storage_ptr__,duckdb *this,unsigned_short input)

{
  undefined8 *puVar1;
  size_type *psVar2;
  long *plVar3;
  undefined8 *puVar4;
  string *extraout_RAX;
  string *psVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x4,(PhysicalType)input);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1da7ed0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_58 = *plVar6;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar6;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_68);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_d8 = *puVar7;
    lStack_d0 = plVar3[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar7;
    local_e8 = (ulong *)*plVar3;
  }
  local_e0 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ConvertToString::Operation<unsigned_short>(&local_88,(uint16_t)this);
  uVar8 = 0xf;
  if (local_e8 != &local_d8) {
    uVar8 = local_d8;
  }
  if (uVar8 < local_88._M_string_length + local_e0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar9 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_88._M_string_length + local_e0) goto LAB_01691616;
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_01691616:
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_88._M_dataplus._M_p);
  }
  local_108 = &local_f8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar4[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar4;
  }
  local_100 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_108);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_b8 = *puVar7;
    lStack_b0 = plVar3[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar7;
    local_c8 = (ulong *)*plVar3;
  }
  local_c0 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  TypeIdToString_abi_cxx11_(&local_a8,(duckdb *)0xc,(PhysicalType)local_c0);
  uVar8 = 0xf;
  if (local_c8 != &local_b8) {
    uVar8 = local_b8;
  }
  if (uVar8 < local_a8._M_string_length + local_c0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar9 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_c0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0169173e;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
LAB_0169173e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar9 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  psVar5 = (string *)&local_48.field_2;
  if ((string *)local_48._M_dataplus._M_p != psVar5) {
    operator_delete(local_48._M_dataplus._M_p);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}